

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alu.cpp
# Opt level: O0

void __thiscall ALCdevice::ProcessBs2b(ALCdevice *this,size_t SamplesToDo)

{
  uint uVar1;
  uint uVar2;
  pointer __n;
  reference pvVar3;
  array<unsigned_int,_16UL> *in_RDI;
  ALuint ridx;
  ALuint lidx;
  size_t in_stack_000000c0;
  FloatBufferLine *in_stack_000000c8;
  BFormatDec *in_stack_000000d0;
  undefined1 in_stack_000000d8 [16];
  size_t in_stack_00000818;
  float *in_stack_00000820;
  float *in_stack_00000828;
  bs2b *in_stack_00000830;
  
  __n = std::unique_ptr<BFormatDec,_std::default_delete<BFormatDec>_>::operator->
                  ((unique_ptr<BFormatDec,_std::default_delete<BFormatDec>_> *)0x1a5ef4);
  al::span<std::array<float,_1024UL>,_18446744073709551615UL>::data
            ((span<std::array<float,_1024UL>,_18446744073709551615UL> *)
             (in_RDI[0x1b7]._M_elems + 10));
  BFormatDec::process(in_stack_000000d0,
                      (span<std::array<float,_1024UL>,_18446744073709551615UL>)in_stack_000000d8,
                      in_stack_000000c8,in_stack_000000c0);
  pvVar3 = std::array<unsigned_int,_16UL>::operator[](in_RDI,(size_type)__n);
  uVar1 = *pvVar3;
  pvVar3 = std::array<unsigned_int,_16UL>::operator[](in_RDI,(size_type)__n);
  uVar2 = *pvVar3;
  std::unique_ptr<bs2b,_std::default_delete<bs2b>_>::get
            ((unique_ptr<bs2b,_std::default_delete<bs2b>_> *)in_RDI);
  al::span<std::array<float,_1024UL>,_18446744073709551615UL>::operator[]
            ((span<std::array<float,_1024UL>,_18446744073709551615UL> *)(in_RDI[0x1b9]._M_elems + 6)
             ,(ulong)uVar1);
  std::array<float,_1024UL>::data((array<float,_1024UL> *)0x1a5fbb);
  al::span<std::array<float,_1024UL>,_18446744073709551615UL>::operator[]
            ((span<std::array<float,_1024UL>,_18446744073709551615UL> *)(in_RDI[0x1b9]._M_elems + 6)
             ,(ulong)uVar2);
  std::array<float,_1024UL>::data((array<float,_1024UL> *)0x1a5fe3);
  bs2b_cross_feed(in_stack_00000830,in_stack_00000828,in_stack_00000820,in_stack_00000818);
  return;
}

Assistant:

void ALCdevice::ProcessBs2b(const size_t SamplesToDo)
{
    /* First, decode the ambisonic mix to the "real" output. */
    AmbiDecoder->process(RealOut.Buffer, Dry.Buffer.data(), SamplesToDo);

    /* BS2B is stereo output only. */
    const ALuint lidx{RealOut.ChannelIndex[FrontLeft]};
    const ALuint ridx{RealOut.ChannelIndex[FrontRight]};

    /* Now apply the BS2B binaural/crossfeed filter. */
    bs2b_cross_feed(Bs2b.get(), RealOut.Buffer[lidx].data(), RealOut.Buffer[ridx].data(),
        SamplesToDo);
}